

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

void __thiscall IDisk::WriteBit(IDisk *this,int side,int track,uchar bit)

{
  MFMTrack *pMVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = this->head_position_;
  pMVar1 = this->side_[side].tracks;
  if (uVar4 < pMVar1[track].size) {
    bVar2 = bit | 2;
    if ((ulong)uVar4 != 0) {
      bVar2 = bit;
    }
    pMVar1[track].bitfield[uVar4] = bVar2;
  }
  this->disk_modified_ = true;
  uVar3 = this->head_position_ + 1;
  this->head_position_ = uVar3;
  uVar4 = 0;
  if (uVar3 < this->side_[side].tracks[track].size) {
    uVar4 = uVar3;
  }
  this->head_position_ = uVar4;
  return;
}

Assistant:

void IDisk::WriteBit(int side, int track, unsigned char bit)
{
   if (head_position_ == 0)
   {
      bit |= BIT_INDEX;
   }

   if (head_position_ < side_[side].tracks[track].size)
      side_[side].tracks[track].bitfield[head_position_] = bit;

   disk_modified_ = true;

   // Weak bit : TO DO

   // Get next bit
   ++head_position_;
   if (head_position_ >= side_[side].tracks[track].size)
   {
      head_position_ = 0;
   }
}